

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O2

OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter> *
__thiscall
kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>::
operator=(OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
          *this,OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                *other)

{
  if (this->tag - 1 < 2) {
    this->tag = 0;
  }
  moveFrom(this,other);
  return this;
}

Assistant:

OneOf& operator=(OneOf&& other) { if (tag != 0) destroy(); moveFrom(other); return *this; }